

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int TestRptrXmmEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                       _func_int_uchar_ptr_x86Size_x86Reg_int_x86Reg_int_x86XmmReg *fun,
                       uint testSize)

{
  x86Reg xVar1;
  x86Reg xVar2;
  x86XmmReg xVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uchar *puVar8;
  long local_58;
  x86Reg *local_50;
  int local_38;
  
  local_58 = 0;
  puVar8 = stream;
  do {
    lVar7 = 0;
    do {
      local_50 = testBaseRegs;
      lVar6 = 0;
      do {
        if ((testSize & 1) != 0) {
          if ((int)lVar6 != 0 || (int)lVar7 != 0) {
            xVar1 = testIndexRegs[lVar7];
            xVar2 = *local_50;
            xVar3 = testXmmRegs[local_58];
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,1,xVar2,0,xVar3);
            iVar4 = (*fun)(puVar8,sDWORD,xVar1,1,xVar2,0,xVar3);
            puVar8 = puVar8 + iVar4;
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,1,xVar2,4,xVar3);
            iVar4 = (*fun)(puVar8,sDWORD,xVar1,1,xVar2,4,xVar3);
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,1,xVar2,0x400,xVar3);
            iVar5 = (*fun)(puVar8 + iVar4,sDWORD,xVar1,1,xVar2,0x400,xVar3);
            puVar8 = puVar8 + iVar4 + iVar5;
          }
          if (lVar7 != 0) {
            xVar1 = testIndexRegs[lVar7];
            xVar2 = *local_50;
            xVar3 = testXmmRegs[local_58];
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,2,xVar2,0,xVar3);
            iVar4 = (*fun)(puVar8,sDWORD,xVar1,2,xVar2,0,xVar3);
            puVar8 = puVar8 + iVar4;
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,2,xVar2,4,xVar3);
            iVar4 = (*fun)(puVar8,sDWORD,xVar1,2,xVar2,4,xVar3);
            EMIT_OP_RPTR_REG(ctx,op,sDWORD,xVar1,2,xVar2,0x400,xVar3);
            iVar5 = (*fun)(puVar8 + iVar4,sDWORD,xVar1,2,xVar2,0x400,xVar3);
            puVar8 = puVar8 + iVar4 + iVar5;
          }
        }
        if ((testSize & 2) != 0) {
          if ((int)lVar6 != 0 || (int)lVar7 != 0) {
            xVar1 = testIndexRegs[lVar7];
            xVar2 = *local_50;
            xVar3 = testXmmRegs[local_58];
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,1,xVar2,0,xVar3);
            iVar4 = (*fun)(puVar8,sQWORD,xVar1,1,xVar2,0,xVar3);
            puVar8 = puVar8 + iVar4;
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,1,xVar2,4,xVar3);
            iVar4 = (*fun)(puVar8,sQWORD,xVar1,1,xVar2,4,xVar3);
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,1,xVar2,0x400,xVar3);
            iVar5 = (*fun)(puVar8 + iVar4,sQWORD,xVar1,1,xVar2,0x400,xVar3);
            puVar8 = puVar8 + iVar4 + iVar5;
          }
          if (lVar7 != 0) {
            xVar1 = testIndexRegs[lVar7];
            xVar2 = *local_50;
            xVar3 = testXmmRegs[local_58];
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,2,xVar2,0,xVar3);
            iVar4 = (*fun)(puVar8,sQWORD,xVar1,2,xVar2,0,xVar3);
            puVar8 = puVar8 + iVar4;
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,2,xVar2,4,xVar3);
            iVar4 = (*fun)(puVar8,sQWORD,xVar1,2,xVar2,4,xVar3);
            EMIT_OP_RPTR_REG(ctx,op,sQWORD,xVar1,2,xVar2,0x400,xVar3);
            iVar5 = (*fun)(puVar8 + iVar4,sQWORD,xVar1,2,xVar2,0x400,xVar3);
            puVar8 = puVar8 + iVar4 + iVar5;
          }
        }
        lVar6 = lVar6 + 1;
        local_50 = local_50 + 1;
      } while (lVar6 != 10);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 9);
    local_58 = local_58 + 1;
  } while (local_58 != 6);
  local_38 = (int)stream;
  return (int)puVar8 - local_38;
}

Assistant:

int TestRptrXmmEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86XmmReg src), unsigned testSize = testSizeDword | testSizeQword)
{
	unsigned char *start = stream;

	for(unsigned xmm = 0; xmm < sizeof(testXmmRegs) / sizeof(testXmmRegs[0]); xmm++)
	{
		for(unsigned index = 0; index < sizeof(testIndexRegs) / sizeof(testIndexRegs[0]); index++)
		{
			for(unsigned base = 0; base < sizeof(testBaseRegs) / sizeof(testBaseRegs[0]); base++)
			{
				if(testSize & testSizeDword)
				{
					// skip RDI-based addressing
					if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testXmmRegs[xmm]);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testXmmRegs[xmm]);
						stream += fun(stream, sDWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testXmmRegs[xmm]);
					}
				}

				if(testSize & testSizeQword)
				{
					// skip RDI-based addressing
					if(testIndexRegs[index] != rNONE || testBaseRegs[base] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 0, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 4, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 1, testBaseRegs[base], 1024, testXmmRegs[xmm]);
					}

					if(testIndexRegs[index] != rNONE)
					{
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 0, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 4, testXmmRegs[xmm]);
						EMIT_OP_RPTR_REG(ctx, op, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testXmmRegs[xmm]);
						stream += fun(stream, sQWORD, testIndexRegs[index], 2, testBaseRegs[base], 1024, testXmmRegs[xmm]);
					}
				}
			}
		}
	}

	return int(stream - start);
}